

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

void __thiscall QMimeData::setText(QMimeData *this,QString *text)

{
  QMimeDataPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  textPlainLiteral();
  ::QVariant::QVariant(&local_48,text);
  QMimeDataPrivate::setData(this_00,(QString *)&local_60,&local_48);
  ::QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeData::setText(const QString &text)
{
    Q_D(QMimeData);
    d->setData(textPlainLiteral(), text);
}